

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O0

void unget(Global *global)

{
  FILEINFO *pFVar1;
  char *pcVar2;
  Global *in_RDI;
  FILEINFO *file;
  
  pFVar1 = in_RDI->infile;
  if (pFVar1 != (FILEINFO *)0x0) {
    pcVar2 = pFVar1->bptr;
    pFVar1->bptr = pcVar2 + -1;
    if (pcVar2 + -1 < pFVar1->buffer) {
      cerror(in_RDI,FATAL_TOO_MUCH_PUSHBACK);
    }
    else if (*pFVar1->bptr == '\n') {
      in_RDI->line = in_RDI->line + -1;
    }
  }
  return;
}

Assistant:

void unget(struct Global *global)
{
  /*
   * Backup the pointer to reread the last character.  Fatal error
   * (code bug) if we backup too far.  unget() may be called,
   * without problems, at end of file.  Only one character may
   * be ungotten.  If you need to unget more, call ungetstring().
   */
 
  FILEINFO *file;
  if ((file = global->infile) == NULL)
    return;			/* Unget after EOF	      */
  if (--file->bptr < file->buffer) {
    cfatal(global, FATAL_TOO_MUCH_PUSHBACK);
    /* This happens only if used the wrong way! */
    return;
  }
  if (*file->bptr == '\n')        	/* Ungetting a newline?       */
    --global->line;			/* Unget the line number, too */
}